

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression_PickTop::Clear(NonMaximumSuppression_PickTop *this)

{
  uint32_t cached_has_bits;
  NonMaximumSuppression_PickTop *this_local;
  
  this->perclass_ = false;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void NonMaximumSuppression_PickTop::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NonMaximumSuppression.PickTop)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  perclass_ = false;
  _internal_metadata_.Clear<std::string>();
}